

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O3

string * __thiscall
cornelich::cycle_formatter::date_from_cycle_abi_cxx11_
          (string *__return_storage_ptr__,cycle_formatter *this,int64_t cycle)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pcVar2;
  undefined1 auVar3 [16];
  node_t *pnVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long *plVar7;
  shared_ptr<cornelich::cycle_formatter::node_t> node;
  _Sp_locker __lock;
  undefined1 local_69;
  node_t *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  int64_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = cycle;
  iVar6 = ((uint)((int)((ulong)(cycle - SUB168(auVar3 * ZEXT816(0x842108421084211),8)) >> 1) +
                 SUB164(auVar3 * ZEXT816(0x842108421084211),8)) >> 4) * -0x1f + (int)cycle;
  plVar7 = (long *)((long)&(this->m_cache)._M_elems[0].
                           super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + (ulong)(uint)(iVar6 * 0x10));
  local_58 = cycle;
  std::_Sp_locker::_Sp_locker((_Sp_locker *)&local_50,plVar7);
  plVar1 = (long *)*plVar7;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)&(this->m_cache)._M_elems[0].
                     super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + (ulong)(uint)(iVar6 * 0x10));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      cycle = local_58;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  std::_Sp_locker::~_Sp_locker((_Sp_locker *)&local_50);
  if ((plVar1 == (long *)0x0) || (*plVar1 != cycle)) {
    (*this->_vptr_cycle_formatter[3])(&local_50,this,cycle);
    local_68 = (node_t *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cornelich::cycle_formatter::node_t,std::allocator<cornelich::cycle_formatter::node_t>,long&,std::__cxx11::string>
              (&local_60,&local_68,(allocator<cornelich::cycle_formatter::node_t> *)&local_69,
               &local_58,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    _Var5._M_pi = local_60._M_pi;
    pnVar4 = local_68;
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      }
    }
    std::_Sp_locker::_Sp_locker((_Sp_locker *)&local_50,plVar7);
    *plVar7 = (long)pnVar4;
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(this->m_cache)._M_elems[0].
                       super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + (ulong)(uint)(iVar6 * 0x10));
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&(this->m_cache)._M_elems[0].
             super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi + (ulong)(uint)(iVar6 * 0x10)) = _Var5._M_pi;
    std::_Sp_locker::~_Sp_locker((_Sp_locker *)&local_50);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (local_68->m_data)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (local_68->m_data)._M_string_length)
    ;
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,plVar1[1],plVar1[2] + plVar1[1]);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cycle_formatter::date_from_cycle(std::int64_t cycle) const
{
    // TODO: Is it worth it...?
    auto hash = std::hash<std::int64_t>()(cycle) % (CACHE_SIZE - 1);
    auto cached = std::atomic_load(&m_cache[hash]);
    if(cached && cached->m_cycle == cycle)
    {
        // Cache hit - return the string
        return cached->m_data;
    }
    // Cache miss -> evaluate and cache the string
    auto node = std::make_shared<node_t>(cycle, date_from_cycle_impl(cycle));
    std::atomic_store(&m_cache[hash], node);
    return node->m_data;
}